

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

RGB __thiscall pbrt::PixelSensor::IlluminantToSensorRGB(PixelSensor *this,SpectrumHandle *illum)

{
  int iVar1;
  undefined1 auVar2 [16];
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  RGB RVar9;
  uint local_88;
  undefined1 local_78 [16];
  SpectrumHandle local_60;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_58;
  SpectrumHandle local_50;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_48;
  SpectrumHandle local_40;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_38.bits =
       (illum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  iVar1 = 0x168;
  local_40.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&this->r_bar | 0x2000000000000);
  do {
    FVar3 = SpectrumHandle::operator()((SpectrumHandle *)&local_38,(float)iVar1);
    auVar5._0_4_ = SpectrumHandle::operator()(&local_40,(float)iVar1);
    auVar5._4_60_ = extraout_var;
    iVar1 = iVar1 + 1;
    auVar2 = vfmadd231ss_fma(local_78,auVar5._0_16_,ZEXT416((uint)FVar3));
    local_78._0_8_ = auVar2._0_8_;
    local_78._8_8_ = auVar2._8_8_;
  } while (iVar1 != 0x33f);
  local_48.bits =
       (illum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  auVar4 = ZEXT816(0) << 0x20;
  iVar1 = 0x168;
  local_50.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&this->g_bar | 0x2000000000000);
  do {
    FVar3 = SpectrumHandle::operator()((SpectrumHandle *)&local_48,(float)iVar1);
    auVar6._0_4_ = SpectrumHandle::operator()(&local_50,(float)iVar1);
    auVar6._4_60_ = extraout_var_00;
    iVar1 = iVar1 + 1;
    auVar4 = vfmadd231ss_fma(auVar4,auVar6._0_16_,ZEXT416((uint)FVar3));
  } while (iVar1 != 0x33f);
  local_58.bits =
       (illum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  auVar8 = ZEXT816(0) << 0x20;
  local_60.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&this->b_bar | 0x2000000000000);
  iVar1 = 0x168;
  do {
    FVar3 = SpectrumHandle::operator()((SpectrumHandle *)&local_58,(float)iVar1);
    auVar7._0_4_ = SpectrumHandle::operator()(&local_60,(float)iVar1);
    auVar7._4_60_ = extraout_var_01;
    iVar1 = iVar1 + 1;
    auVar8 = vfmadd231ss_fma(ZEXT416(auVar8._0_4_),auVar7._0_16_,ZEXT416((uint)FVar3));
  } while (iVar1 != 0x33f);
  local_88 = auVar4._0_4_;
  auVar2 = vinsertps_avx(auVar2,ZEXT416(local_88),0x10);
  auVar4._8_4_ = 0x42d5b6bb;
  auVar4._0_8_ = 0x42d5b6bb42d5b6bb;
  auVar4._12_4_ = 0x42d5b6bb;
  auVar2 = vdivps_avx512vl(auVar2,auVar4);
  auVar4 = vmovshdup_avx(auVar2);
  auVar2 = vdivps_avx(auVar2,auVar4);
  RVar9.b = (auVar8._0_4_ / 106.856895) / auVar4._0_4_;
  RVar9._0_8_ = auVar2._0_8_;
  return RVar9;
}

Assistant:

RGB IlluminantToSensorRGB(SpectrumHandle illum) const {
        RGB rgb(InnerProduct(illum, &r_bar), InnerProduct(illum, &g_bar),
                InnerProduct(illum, &b_bar));
        return rgb / rgb.g;
    }